

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O1

Matrix * __thiscall Matrix::transpose(Matrix *this)

{
  uint uVar1;
  double *pdVar2;
  long lVar3;
  shared_count sVar4;
  int iVar5;
  double *__tmp;
  void *pvVar6;
  double *p;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  long lVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  shared_count sStack_48;
  double *local_40;
  shared_count local_38;
  
  uVar1 = this->nMatrixDimension;
  lVar13 = (long)(int)uVar1;
  uVar16 = lVar13 * 4;
  if (lVar13 < 0) {
    uVar16 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar16);
  iVar15 = this->nData;
  lVar12 = (long)iVar15;
  uVar14 = lVar12 * 8;
  if (lVar12 < 0) {
    uVar14 = 0xffffffffffffffff;
  }
  p = (double *)operator_new__(uVar14);
  piVar7 = (int *)operator_new__(uVar16);
  if (0 < lVar13) {
    piVar8 = this->pSize;
    piVar9 = piVar7;
    lVar10 = lVar13;
    do {
      *piVar9 = piVar8[lVar10 + -1];
      piVar9 = piVar9 + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  piVar8 = (int *)operator_new__(uVar16);
  if (uVar1 != 0) {
    iVar5 = 1;
    lVar10 = lVar13;
    do {
      piVar8[lVar10 + -1] = iVar5;
      iVar5 = iVar5 * piVar7[lVar10 + -1];
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  if (0 < iVar15) {
    pdVar2 = this->pData;
    piVar9 = this->pMult;
    lVar10 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar16 = 0;
        lVar3 = lVar10;
        do {
          iVar15 = (int)lVar3;
          lVar3 = (long)iVar15 % (long)piVar9[uVar16];
          *(int *)((long)pvVar6 + uVar16 * 4) = iVar15 / piVar9[uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar1 != uVar16);
      }
      uVar16 = 0;
      if (0 < (int)uVar1) {
        iVar15 = 0;
        piVar11 = (int *)((long)pvVar6 + lVar13 * 4);
        do {
          piVar11 = piVar11 + -1;
          iVar15 = iVar15 + piVar8[uVar16] * *piVar11;
          uVar16 = uVar16 + 1;
        } while (uVar1 != uVar16);
        uVar16 = (ulong)iVar15;
      }
      p[uVar16] = pdVar2[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar12);
  }
  if (this->pMult != (int *)0x0) {
    operator_delete__(this->pMult);
  }
  this->pMult = piVar8;
  if (this->pSize != (int *)0x0) {
    operator_delete__(this->pSize);
  }
  this->pSize = piVar7;
  this->pData = p;
  boost::detail::shared_count::shared_count<double*,MatrixDataDeleter>
            (&sStack_48,p,(MatrixDataDeleter)SUB41(*(undefined4 *)&this->bReference,0));
  sVar4.pi_ = sStack_48.pi_;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_40 = (this->matrixParent).px;
  (this->matrixParent).px = p;
  local_38.pi_ = (this->matrixParent).pn.pi_;
  (this->matrixParent).pn.pi_ = sVar4.pi_;
  boost::detail::shared_count::~shared_count(&local_38);
  boost::detail::shared_count::~shared_count(&sStack_48);
  return this;
}

Assistant:

Matrix &Matrix::transpose()
{
	int *indexes = new int[nMatrixDimension]; // array with indexes
	double *newData = new double[nData]; // array for re-arranged values
	
	// array with new shape
	int *newSize = new int[nMatrixDimension]; 
	for( int i=0; i<nMatrixDimension; i++ )
		newSize[i] = pSize[nMatrixDimension- i-1];
	
	// array with new multipliers
	int *newMult = new int[nMatrixDimension];
	int m = 1;
	for(int i=nMatrixDimension-1; i+1; i--) {
		newMult[i] = m;
		m *= newSize[i];
	}
	
	for( int i=0; i<nData; i++ ) {
		// find index of data i
		int remainder = i;
		for( int j=0; j<nMatrixDimension; j++) {
			indexes[j] = remainder / pMult[j];
			remainder -= indexes[j] * pMult[j]; // modulo :-)
		}
		// find new offset by re-interpreting index
		int newOffset = 0;
		for( int j=0; j<nMatrixDimension; j++)
			newOffset += indexes[nMatrixDimension-j-1] * newMult[j];
		// write into new position
		newData[ newOffset ] = pData[i];
	}	
	
	// save new data
	delete[] pMult;
	pMult = newMult;
	delete[] pSize;
	pSize = newSize;
	pData = newData;
	matrixParent = shared_array<double>(newData, MatrixDataDeleter(this));
	
	// bye.
	return *this;
}